

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ResultBuilder * __thiscall
Catch::ExpressionLhs<char_const(&)[2]>::
captureExpression<(Catch::Internal::Operator)0,std::__cxx11::string>
          (ExpressionLhs<char_const(&)[2]> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  bool result;
  ResultBuilder *pRVar1;
  char *value;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38;
  
  pRVar1 = *(ResultBuilder **)this;
  result = std::operator==(*(char **)(this + 8),rhs);
  pRVar1 = ResultBuilder::setResultType(pRVar1,result);
  Catch::toString_abi_cxx11_(&local_38,*(Catch **)(this + 8),value);
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_38);
  Catch::toString(&local_58,rhs);
  pRVar1 = ResultBuilder::setRhs(pRVar1,&local_58);
  std::__cxx11::string::string((string *)&local_78,"==",&local_79);
  pRVar1 = ResultBuilder::setOp(pRVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }